

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::types_are_logically_equivalent(Compiler *this,SPIRType *a,SPIRType *b)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  SPIRType *a_00;
  SPIRType *b_00;
  size_t i;
  size_t sVar5;
  bool bVar6;
  
  uVar1 = *(uint *)&(a->super_IVariant).field_0xc;
  if ((((((uVar1 == *(uint *)&(b->super_IVariant).field_0xc) && (a->width == b->width)) &&
        (a->vecsize == b->vecsize)) &&
       ((a->columns == b->columns &&
        (sVar2 = (a->array).super_VectorView<unsigned_int>.buffer_size,
        sVar2 == (b->array).super_VectorView<unsigned_int>.buffer_size)))) &&
      ((sVar2 == 0 ||
       (iVar4 = bcmp((a->array).super_VectorView<unsigned_int>.ptr,
                     (b->array).super_VectorView<unsigned_int>.ptr,sVar2 << 2), iVar4 == 0)))) &&
     ((((uVar1 & 0xfffffffe) != 0x10 || ((a->image).type.id == (b->image).type.id)) &&
      (sVar2 = (a->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size,
      sVar2 == (b->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size)))) {
    sVar5 = 0;
    do {
      bVar6 = sVar2 == sVar5;
      if (bVar6) {
        return bVar6;
      }
      a_00 = get<spirv_cross::SPIRType>
                       (this,(a->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [sVar5].id);
      b_00 = get<spirv_cross::SPIRType>
                       (this,(b->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [sVar5].id);
      bVar3 = types_are_logically_equivalent(this,a_00,b_00);
      sVar5 = sVar5 + 1;
    } while (bVar3);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Compiler::types_are_logically_equivalent(const SPIRType &a, const SPIRType &b) const
{
	if (a.basetype != b.basetype)
		return false;
	if (a.width != b.width)
		return false;
	if (a.vecsize != b.vecsize)
		return false;
	if (a.columns != b.columns)
		return false;
	if (a.array.size() != b.array.size())
		return false;

	size_t array_count = a.array.size();
	if (array_count && memcmp(a.array.data(), b.array.data(), array_count * sizeof(uint32_t)) != 0)
		return false;

	if (a.basetype == SPIRType::Image || a.basetype == SPIRType::SampledImage)
	{
		if (memcmp(&a.image, &b.image, sizeof(SPIRType::Image)) != 0)
			return false;
	}

	if (a.member_types.size() != b.member_types.size())
		return false;

	size_t member_types = a.member_types.size();
	for (size_t i = 0; i < member_types; i++)
	{
		if (!types_are_logically_equivalent(get<SPIRType>(a.member_types[i]), get<SPIRType>(b.member_types[i])))
			return false;
	}

	return true;
}